

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Schema __thiscall capnp::SchemaLoader::load(SchemaLoader *this,Reader *reader)

{
  RawSchema *pRVar1;
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> local_20;
  
  kj::_::Mutex::lock((Mutex *)this,EXCLUSIVE);
  local_20.ptr = &(this->impl).value;
  local_20.mutex = (Mutex *)this;
  pRVar1 = Impl::load((this->impl).value.ptr,reader,false);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked(&local_20);
  return (Schema)&pRVar1->defaultBrand;
}

Assistant:

Schema SchemaLoader::load(const schema::Node::Reader& reader) {
  return Schema(&impl.lockExclusive()->get()->load(reader, false)->defaultBrand);
}